

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O2

uint32_t get_dist_len_price(lzma_lzma1_encoder *coder,uint32_t dist,uint32_t len,uint32_t pos_state)

{
  sbyte sVar1;
  int iVar2;
  sbyte sVar3;
  uint32_t uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar5 = 3;
  if (len < 6) {
    uVar5 = (ulong)(len - 2);
  }
  if (dist < 0x80) {
    uVar4 = coder->dist_prices[uVar5][dist];
  }
  else {
    sVar1 = 0x1e;
    if (-1 < (int)dist) {
      sVar1 = 0x12;
    }
    iVar2 = 0x3c;
    if (-1 < (int)dist) {
      iVar2 = 0x24;
    }
    sVar3 = 6;
    if (0x7ffff < dist) {
      sVar3 = sVar1;
    }
    iVar6 = 0xc;
    if (0x7ffff < dist) {
      iVar6 = iVar2;
    }
    uVar4 = coder->align_prices[dist & 0xf] +
            coder->dist_slot_prices[uVar5][(uint)""[dist >> sVar3] + iVar6];
  }
  return uVar4 + (coder->match_len_encoder).prices[pos_state][len - 2];
}

Assistant:

static inline uint32_t
get_dist_len_price(const lzma_lzma1_encoder *const coder, const uint32_t dist,
		const uint32_t len, const uint32_t pos_state)
{
	const uint32_t dist_state = get_dist_state(len);
	uint32_t price;

	if (dist < FULL_DISTANCES) {
		price = coder->dist_prices[dist_state][dist];
	} else {
		const uint32_t dist_slot = get_dist_slot_2(dist);
		price = coder->dist_slot_prices[dist_state][dist_slot]
				+ coder->align_prices[dist & ALIGN_MASK];
	}

	price += get_len_price(&coder->match_len_encoder, len, pos_state);

	return price;
}